

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O2

void __thiscall
boost::runtime::
argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
::produce_argument(argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   *this,cstring *source,cstring *param_name,arguments_store *store)

{
  cstring local_58;
  string local_48;
  cstring local_28;
  cstring local_18;
  
  local_58.m_begin = param_name->m_begin;
  local_58.m_end = param_name->m_end;
  if (source->m_end == source->m_begin) {
    std::__cxx11::string::string((string *)&local_48,(string *)&this->m_optional_value);
  }
  else {
    local_28.m_begin = source->m_begin;
    local_28.m_end = source->m_end;
    local_18.m_begin = local_58.m_begin;
    local_18.m_end = local_58.m_end;
    value_interpreter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ::interpret(&local_48,
                (value_interpreter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 *)this,&local_18,&local_28);
  }
  arguments_store::set<std::__cxx11::string>(store,&local_58,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void        produce_argument( cstring source, cstring param_name, arguments_store& store ) const
    {
        store.set( param_name, source.empty() ? m_optional_value : m_interpreter.interpret( param_name, source ) );
    }